

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O3

int ffsrow(fitsfile *infptr,fitsfile *outfptr,char *expr,int *status)

{
  char *pcVar1;
  char cVar2;
  size_t nchars;
  long firstrow;
  bool bVar3;
  int iVar4;
  long lVar5;
  uchar *values;
  long lVar6;
  FITSfile *pFVar7;
  long lVar8;
  LONGLONG bytepos;
  size_t __size;
  LONGLONG nrows;
  long lVar9;
  long nelem;
  LONGLONG local_238;
  long local_218;
  long local_208;
  LONGLONG offset;
  long local_1f8;
  size_t local_1f0;
  LONGLONG repeat;
  long local_1e0;
  int naxis;
  parseInfo Info;
  ParseData lParse;
  long naxes [5];
  
  if (*status != 0) {
    return *status;
  }
  memset(&Info,0,0x90);
  iVar4 = ffiprs(infptr,0,expr,5,&Info.datatype,&local_1e0,&naxis,naxes,&lParse,status);
  if (iVar4 == 0) {
    lVar5 = -local_1e0;
    if (0 < local_1e0) {
      lVar5 = local_1e0;
    }
    if ((Info.datatype != 0xe) || (lVar5 != 1)) {
      ffcprs(&lParse);
      ffpmsg("Expression does not evaluate to a logical scalar.");
      *status = 0x1b0;
      return 0x1b0;
    }
    if (infptr->HDUposition != infptr->Fptr->curhdu) {
      ffmahd(infptr,infptr->HDUposition + 1,(int *)0x0,status);
    }
    if (*status == 0) {
      pFVar7 = infptr->Fptr;
      lVar5 = pFVar7->numrows;
      if (lVar5 != 0) {
        nchars = pFVar7->rowlength;
        local_208 = pFVar7->heapsize;
        pFVar7 = outfptr->Fptr;
        if (outfptr->HDUposition != pFVar7->curhdu) {
          ffmahd(outfptr,outfptr->HDUposition + 1,(int *)0x0,status);
          pFVar7 = outfptr->Fptr;
        }
        if (pFVar7->datastart < 0) {
          ffrdef(outfptr,status);
        }
        if (*status == 0) {
          pFVar7 = outfptr->Fptr;
          firstrow = pFVar7->numrows;
          if (firstrow == 0) {
            pFVar7->heapsize = 0;
            local_218 = 0;
          }
          else {
            local_218 = pFVar7->heapsize;
          }
          if (nchars != pFVar7->rowlength) {
            ffpmsg("Output table has different row length from input");
            ffcprs(&lParse);
            *status = 0x1b4;
            return 0x1b4;
          }
          local_1f0 = lVar5 + 1;
          Info.dataPtr = malloc(local_1f0);
          Info.nullPtr = (void *)0x0;
          Info.maxRows = lVar5;
          Info.parseData = &lParse;
          if (Info.dataPtr == (void *)0x0) {
            ffpmsg("Unable to allocate memory for row selection");
LAB_0012b254:
            ffcprs(&lParse);
            *status = 0x71;
            return 0x71;
          }
          *(undefined1 *)((long)Info.dataPtr + lVar5) = 0;
          if (local_1e0 < 0) {
            cVar2 = lParse.Nodes[lParse.resultNode].value.data.log;
            if (0 < lVar5) {
              lVar8 = 0;
              do {
                *(char *)((long)Info.dataPtr + lVar8) = cVar2;
                lVar8 = lVar8 + 1;
              } while (lVar5 != lVar8);
            }
            nrows = 0;
            if (cVar2 != '\0') {
              nrows = lVar5;
            }
          }
          else {
            ffiter(lParse.nCols,lParse.colData,0,0,fits_parser_workfn,&Info,status);
            nrows = 0;
            if (0 < lVar5) {
              lVar8 = 0;
              nrows = 0;
              do {
                nrows = (nrows + 1) - (ulong)(*(char *)((long)Info.dataPtr + lVar8) == '\0');
                lVar8 = lVar8 + 1;
              } while (lVar5 != lVar8);
            }
          }
          if (*status == 0) {
            __size = 500000;
            if (500000 < (long)nchars) {
              __size = nchars;
            }
            values = (uchar *)malloc(__size);
            if (values != (uchar *)0x0) {
              lVar6 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(500000)) / SEXT816((long)nchars),0);
              lVar8 = 1;
              if (lVar6 < 2) {
                lVar6 = 1;
              }
              if (infptr == outfptr) {
                lVar8 = 0;
                do {
                  local_238 = lVar8 + 1;
                  pcVar1 = (char *)((long)Info.dataPtr + lVar8);
                  lVar8 = local_238;
                } while (*pcVar1 != '\0');
              }
              else {
                local_238 = firstrow + 1;
                if (0 < firstrow) {
                  ffirow(outfptr,firstrow,nrows,status);
                }
              }
              local_1f8 = lVar6 * nchars;
LAB_0012b361:
              lVar9 = 0;
              do {
                if (*(char *)((long)Info.dataPtr + lVar8 + -1) != '\0') {
                  ffgtbb(infptr,lVar8,1,nchars,values + lVar9 * nchars,status);
                  lVar9 = lVar9 + 1;
                  if (lVar9 == lVar6) goto LAB_0012b3b0;
                }
                if ((lVar5 <= lVar8) || (lVar8 = lVar8 + 1, *status != 0)) {
                  if (lVar9 != 0) {
                    ffptbb(outfptr,local_238,1,nchars * lVar9,values,status);
                    local_238 = local_238 + lVar9;
                  }
                  goto LAB_0012b422;
                }
              } while( true );
            }
            goto LAB_0012b254;
          }
          goto LAB_0012b699;
        }
      }
    }
  }
  ffcprs(&lParse);
  goto LAB_0012b048;
LAB_0012b3b0:
  ffptbb(outfptr,local_238,1,local_1f8,values,status);
  local_238 = local_238 + lVar6;
  if ((lVar5 <= lVar8) || (lVar8 = lVar8 + 1, *status != 0)) goto LAB_0012b422;
  goto LAB_0012b361;
LAB_0012b422:
  if (infptr == outfptr) {
    if (local_238 <= lVar5) {
      ffdrow(infptr,local_238,local_1f0 - local_238,status);
    }
  }
  else if ((local_208 != 0) && (nrows != 0)) {
    pFVar7 = outfptr->Fptr;
    if (outfptr->HDUposition != pFVar7->curhdu) {
      ffmahd(outfptr,outfptr->HDUposition + 1,(int *)0x0,status);
      pFVar7 = outfptr->Fptr;
    }
    lVar5 = pFVar7->datastart;
    lVar8 = pFVar7->heapstart + local_218;
    lVar6 = (lVar8 + 0xb3f) % 0xb40;
    if (0xb3f - lVar6 < local_208) {
      ffiblk(outfptr,(lVar6 + local_208) / 0xb40,1,status);
    }
    ffukyj(outfptr,"PCOUNT",local_208 + local_218,(char *)0x0,status);
    pFVar7 = infptr->Fptr;
    if (infptr->HDUposition != pFVar7->curhdu) {
      ffmahd(infptr,infptr->HDUposition + 1,(int *)0x0,status);
      pFVar7 = infptr->Fptr;
    }
    bytepos = pFVar7->heapstart + pFVar7->datastart;
    lVar8 = lVar8 + lVar5;
    do {
      if (*status != 0) break;
      lVar5 = 500000;
      if (local_208 < 500000) {
        lVar5 = local_208;
      }
      ffmbyt(infptr,bytepos,0,status);
      ffgbyt(infptr,lVar5,values,status);
      ffmbyt(outfptr,lVar8,1,status);
      ffpbyt(outfptr,lVar5,values,status);
      bytepos = bytepos + lVar5;
      lVar8 = lVar8 + lVar5;
      local_208 = local_208 - lVar5;
    } while (local_208 != 0);
    if ((local_218 != 0) && (pFVar7 = outfptr->Fptr, 0 < pFVar7->tfield)) {
      lVar5 = 1;
      do {
        if ((pFVar7->tableptr[lVar5 + -1].tdatatype < 0) && (lVar8 = firstrow, 0 < nrows)) {
          do {
            lVar8 = lVar8 + 1;
            ffgdesll(outfptr,(int)lVar5,lVar8,&repeat,&offset,status);
            offset = offset + local_218;
            ffpdes(outfptr,(int)lVar5,lVar8,repeat,offset,status);
          } while (lVar8 < nrows + firstrow);
          pFVar7 = outfptr->Fptr;
        }
        bVar3 = lVar5 < pFVar7->tfield;
        lVar5 = lVar5 + 1;
      } while (bVar3);
    }
  }
  free(values);
LAB_0012b699:
  if (Info.dataPtr == (void *)0x0) {
    printf("invalid free(Info.dataPtr) at %s:%d\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/support/cfitsio/cfitsio-4.6.2/eval_f.c"
           ,400);
  }
  else {
    free(Info.dataPtr);
  }
  ffcprs(&lParse);
  ffcmph(outfptr,status);
LAB_0012b048:
  return *status;
}

Assistant:

int ffsrow( fitsfile *infptr,   /* I - Input FITS file                      */
            fitsfile *outfptr,  /* I - Output FITS file                     */
            char     *expr,     /* I - Boolean expression                   */
            int      *status )  /* O - Error status                         */
/*                                                                          */
/* Evaluate an expression on all rows of a table.  If the input and output  */
/* files are not the same, copy the TRUE rows to the output file.  If the   */
/* files are the same, delete the FALSE rows (preserve the TRUE rows).      */
/* Can copy rows between extensions of the same file, *BUT* if output       */
/* extension is before the input extension, the second extension *MUST* be  */
/* opened using ffreopen, so that CFITSIO can handle changing file lengths. */
/*--------------------------------------------------------------------------*/
{
   parseInfo Info;
   int naxis, constant;
   long nelem, rdlen, naxes[MAXDIMS], maxrows, nbuff, nGood, inloc, outloc;
   LONGLONG ntodo, inbyteloc, outbyteloc, hsize;
   long freespace;
   unsigned char *buffer, result;
   struct {
      LONGLONG rowLength, numRows, heapSize;
      LONGLONG dataStart, heapStart;
   } inExt, outExt;
   ParseData lParse;

   if( *status ) return( *status );

   memset(&Info, 0, sizeof(Info));   
   memset(&inExt, 0, sizeof(inExt));
   memset(&outExt, 0, sizeof(outExt));

   if( ffiprs( infptr, 0, expr, MAXDIMS, &Info.datatype, &nelem, &naxis,
               naxes, &lParse, status ) ) {
      ffcprs(&lParse);
      return( *status );
   }

   if( nelem<0 ) {
      constant = 1;
      nelem = -nelem;
   } else
      constant = 0;

   /**********************************************************************/
   /* Make sure expression evaluates to the right type... logical scalar */
   /**********************************************************************/

   if( Info.datatype!=TLOGICAL || nelem!=1 ) {
      ffcprs(&lParse);
      ffpmsg("Expression does not evaluate to a logical scalar.");
      return( *status = PARSE_BAD_TYPE );
   }

   /***********************************************************/
   /*  Extract various table information from each extension  */
   /***********************************************************/

   if( infptr->HDUposition != (infptr->Fptr)->curhdu )
      ffmahd( infptr, (infptr->HDUposition) + 1, NULL, status );
   if( *status ) {
      ffcprs(&lParse);
      return( *status );
   }
   inExt.rowLength = (long) (infptr->Fptr)->rowlength;
   inExt.numRows   = (infptr->Fptr)->numrows;
   inExt.heapSize  = (infptr->Fptr)->heapsize;
   if( inExt.numRows == 0 ) { /* Nothing to copy */
      ffcprs(&lParse);
      return( *status );
   }

   if( outfptr->HDUposition != (outfptr->Fptr)->curhdu )
      ffmahd( outfptr, (outfptr->HDUposition) + 1, NULL, status );
   if( (outfptr->Fptr)->datastart < 0 )
      ffrdef( outfptr, status );
   if( *status ) {
      ffcprs(&lParse);
      return( *status );
   }
   outExt.rowLength = (long) (outfptr->Fptr)->rowlength;
   outExt.numRows   = (outfptr->Fptr)->numrows;
   if( !outExt.numRows )
      (outfptr->Fptr)->heapsize = 0L;
   outExt.heapSize  = (outfptr->Fptr)->heapsize;

   if( inExt.rowLength != outExt.rowLength ) {
      ffpmsg("Output table has different row length from input");
      ffcprs(&lParse);
      return( *status = PARSE_BAD_OUTPUT );
   }

   /***********************************/
   /*  Fill out Info data for parser  */
   /***********************************/

   Info.dataPtr = (char *)malloc( (size_t) ((inExt.numRows + 1) * sizeof(char)) );
   Info.nullPtr = NULL;
   Info.maxRows = (long) inExt.numRows;
   Info.parseData = &lParse;
   if( !Info.dataPtr ) {
      ffpmsg("Unable to allocate memory for row selection");
      ffcprs(&lParse);
      return( *status = MEMORY_ALLOCATION );
   }
   
   /* make sure array is zero terminated */
   ((char*)Info.dataPtr)[inExt.numRows] = 0;

   if( constant ) { /*  Set all rows to the same value from constant result  */

      result = lParse.Nodes[lParse.resultNode].value.data.log;
      for( ntodo = 0; ntodo<inExt.numRows; ntodo++ )
         ((char*)Info.dataPtr)[ntodo] = result;
      nGood = (long) (result ? inExt.numRows : 0);

   } else {

      ffiter( lParse.nCols, lParse.colData, 0L, 0L,
              fits_parser_workfn, (void*)&Info, status );

      nGood = 0;
      for( ntodo = 0; ntodo<inExt.numRows; ntodo++ )
         if( ((char*)Info.dataPtr)[ntodo] ) nGood++;
   }

   if( *status ) {
      /* Error... Do nothing */
   } else {
      rdlen  = (long) inExt.rowLength;
      buffer = (unsigned char *)malloc(maxvalue(500000,rdlen) * sizeof(char) );
      if( buffer==NULL ) {
         ffcprs(&lParse);
         return( *status=MEMORY_ALLOCATION );
      }
      maxrows = maxvalue( (500000L/rdlen), 1);
      nbuff = 0;
      inloc = 1;
      if( infptr==outfptr ) { /* Skip initial good rows if input==output file */
         while( ((char*)Info.dataPtr)[inloc-1] ) inloc++;
         outloc = inloc;
      } else {
         outloc = (long) (outExt.numRows + 1);
         if (outloc > 1) 
            ffirow( outfptr, outExt.numRows, nGood, status );
      }

      do {
         if( ((char*)Info.dataPtr)[inloc-1] ) {
            ffgtbb( infptr, inloc, 1L, rdlen, buffer+rdlen*nbuff, status );
            nbuff++;
            if( nbuff==maxrows ) {
               ffptbb( outfptr, outloc, 1L, rdlen*nbuff, buffer,  status );
               outloc += nbuff;
               nbuff = 0;
            }
         }
         inloc++;
      } while( !*status && inloc<=inExt.numRows );

      if( nbuff ) {
         ffptbb( outfptr, outloc, 1L, rdlen*nbuff, buffer,  status );
         outloc += nbuff;
      }

      if( infptr==outfptr ) {

         if( outloc<=inExt.numRows )
            ffdrow( infptr, outloc, inExt.numRows-outloc+1, status );

      } else if( inExt.heapSize && nGood ) {

         /* Copy heap, if it exists and at least one row copied */

         /********************************************************/
         /*  Get location information from the output extension  */
         /********************************************************/

         if( outfptr->HDUposition != (outfptr->Fptr)->curhdu )
            ffmahd( outfptr, (outfptr->HDUposition) + 1, NULL, status );
         outExt.dataStart = (outfptr->Fptr)->datastart;
         outExt.heapStart = (outfptr->Fptr)->heapstart;

         /*************************************************/
         /*  Insert more space into outfptr if necessary  */
         /*************************************************/

         hsize     = outExt.heapStart + outExt.heapSize;
         freespace = (long) (( ( (hsize + 2879) / 2880) * 2880) - hsize);
         ntodo     = inExt.heapSize;

         if ( (freespace - ntodo) < 0) {       /* not enough existing space? */
            ntodo = (ntodo - freespace + 2879) / 2880;  /* number of blocks  */
            ffiblk(outfptr, (long) ntodo, 1, status);   /* insert the blocks */
         }
         ffukyj( outfptr, "PCOUNT", inExt.heapSize+outExt.heapSize,
                 NULL, status );

         /*******************************************************/
         /*  Get location information from the input extension  */
         /*******************************************************/

         if( infptr->HDUposition != (infptr->Fptr)->curhdu )
            ffmahd( infptr, (infptr->HDUposition) + 1, NULL, status );
         inExt.dataStart = (infptr->Fptr)->datastart;
         inExt.heapStart = (infptr->Fptr)->heapstart;

         /**********************************/
         /*  Finally copy heap to outfptr  */
         /**********************************/

         ntodo  =  inExt.heapSize;
         inbyteloc  =  inExt.heapStart +  inExt.dataStart;
         outbyteloc = outExt.heapStart + outExt.dataStart + outExt.heapSize;

         while ( ntodo && !*status ) {
            rdlen = (long) minvalue(ntodo,500000);
            ffmbyt( infptr,  inbyteloc,  REPORT_EOF, status );
            ffgbyt( infptr,  rdlen,  buffer,     status );
            ffmbyt( outfptr, outbyteloc, IGNORE_EOF, status );
            ffpbyt( outfptr, rdlen,  buffer,     status );
            inbyteloc  += rdlen;
            outbyteloc += rdlen;
            ntodo  -= rdlen;
         }

         /***********************************************************/
         /*  But must update DES if data is being appended to a     */
         /*  pre-existing heap space.  Edit each new entry in file  */
         /***********************************************************/

         if( outExt.heapSize ) {
            LONGLONG repeat, offset, j;
            int i;
            for( i=1; i<=(outfptr->Fptr)->tfield; i++ ) {
               if( (outfptr->Fptr)->tableptr[i-1].tdatatype<0 ) {
                  for( j=outExt.numRows+1; j<=outExt.numRows+nGood; j++ ) {
                     ffgdesll( outfptr, i, j, &repeat, &offset, status );
                     offset += outExt.heapSize;
                     ffpdes( outfptr, i, j, repeat, offset, status );
                  }
               }
            }
         }

      } /*  End of HEAP copy  */

      FREE(buffer);
   }

   FREE(Info.dataPtr);
   ffcprs(&lParse);

   ffcmph(outfptr, status);  /* compress heap, deleting any orphaned data */
   return(*status);
}